

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O3

Gli_Obj_t * Gli_ObjAlloc(Gli_Man_t *p,int nFanins,int nFanouts)

{
  Gli_Obj_t *pGVar1;
  
  pGVar1 = (Gli_Obj_t *)(p->pObjData + p->iObjData);
  pGVar1->Handle = p->iObjData;
  *(uint *)pGVar1 = (nFanins & 7U) << 4 | *(uint *)pGVar1 & 0xf | nFanouts << 7;
  p->iObjData = p->iObjData + (nFanouts & 0x1ffffffU) + (nFanins & 7U) + 8;
  p->nObjs = p->nObjs + 1;
  return pGVar1;
}

Assistant:

Gli_Obj_t * Gli_ObjAlloc( Gli_Man_t * p, int nFanins, int nFanouts )
{
    Gli_Obj_t * pObj;
    pObj = Gli_ManObj( p, p->iObjData );
    pObj->Handle   = p->iObjData;
    pObj->nFanins  = nFanins;
    pObj->nFanouts = nFanouts;
    p->iObjData += Gli_ObjSize( pObj );
    p->nObjs++;
    return pObj;
}